

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

c_float compute_pri_tol(OSQPWorkspace *work,c_float eps_abs,c_float eps_rel)

{
  long *in_RDI;
  double in_XMM0_Qa;
  c_float cVar1;
  double in_XMM1_Qa;
  c_float temp_rel_eps;
  c_float max_rel_eps;
  c_float local_38;
  c_float local_30;
  c_float local_20;
  
  if ((*(long *)(in_RDI[0x17] + 0x10) == 0) || (*(long *)(in_RDI[0x17] + 0x90) != 0)) {
    cVar1 = vec_norm_inf((c_float *)in_RDI[8],*(c_int *)(*in_RDI + 8));
    local_38 = vec_norm_inf((c_float *)in_RDI[0xc],*(c_int *)(*in_RDI + 8));
    if (local_38 < cVar1) {
      local_38 = cVar1;
    }
    local_20 = local_38;
  }
  else {
    cVar1 = vec_scaled_norm_inf(*(c_float **)(in_RDI[0x18] + 0x28),(c_float *)in_RDI[8],
                                *(c_int *)(*in_RDI + 8));
    local_30 = vec_scaled_norm_inf(*(c_float **)(in_RDI[0x18] + 0x28),(c_float *)in_RDI[0xc],
                                   *(c_int *)(*in_RDI + 8));
    if (local_30 < cVar1) {
      local_30 = cVar1;
    }
    local_20 = local_30;
  }
  return in_XMM1_Qa * local_20 + in_XMM0_Qa;
}

Assistant:

c_float compute_pri_tol(OSQPWorkspace *work, c_float eps_abs, c_float eps_rel) {
  c_float max_rel_eps, temp_rel_eps;

  // max_rel_eps = max(||z||, ||A x||)
  if (work->settings->scaling && !work->settings->scaled_termination) {
    // ||Einv * z||
    max_rel_eps =
      vec_scaled_norm_inf(work->scaling->Einv, work->z, work->data->m);

    // ||Einv * A * x||
    temp_rel_eps = vec_scaled_norm_inf(work->scaling->Einv,
                                       work->Ax,
                                       work->data->m);

    // Choose maximum
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);
  } else { // No unscaling required
    // ||z||
    max_rel_eps = vec_norm_inf(work->z, work->data->m);

    // ||A * x||
    temp_rel_eps = vec_norm_inf(work->Ax, work->data->m);

    // Choose maximum
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);
  }

  // eps_prim
  return eps_abs + eps_rel * max_rel_eps;
}